

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O3

void __thiscall cmLoadedCommand::~cmLoadedCommand(cmLoadedCommand *this)

{
  ~cmLoadedCommand(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

cmLoadedCommand::~cmLoadedCommand()
{
  if (this->info.Destructor) {
    cmLoadedCommand::InstallSignalHandlers(info.Name);
    this->info.Destructor(&this->info);
    cmLoadedCommand::InstallSignalHandlers(info.Name, 1);
  }
  if (this->info.Error) {
    free(this->info.Error);
  }
}